

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  bool bVar3;
  bool bVar4;
  ContextType CVar5;
  char *__s;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  DataType dataType;
  DataType dataType_00;
  long lVar9;
  string shaderSource;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea0;
  DataType local_e8c;
  long local_e88;
  allocator<char> local_e79;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  long local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  _Var10._M_p = (pointer)&local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffff150,"texture: Invalid P type.","");
  NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p != &local_ea0) {
    operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
  }
  lVar9 = 0;
  do {
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar9];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_2d8 = lVar9;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_e79);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x9ba7d3);
      _Var10._M_p = (pointer)&local_ea0;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar7) {
        local_ea0._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_ea0._8_8_ = plVar6[3];
      }
      else {
        local_ea0._M_allocated_capacity = paVar7->_M_allocated_capacity;
        _Var10._M_p = (pointer)*plVar6;
      }
      lVar9 = plVar6[1];
      *plVar6 = (long)paVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      NegativeTestContext::beginSection(ctx,(string *)&stack0xfffffffffffff150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != &local_ea0) {
        operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      lVar8 = 0;
      do {
        local_e88 = lVar8;
        if (lVar8 != 4) {
          DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + lVar8);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_2f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_318);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) {
            operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_338,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_358,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_378,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_378);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        local_e8c = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + local_e88);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_3d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + local_e88);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x28,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_418,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x28,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_dataplus._M_p != &local_438.field_2) {
          operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x35,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_458,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x35,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_478,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_478);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3c,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_498,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3c,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_4d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_4f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_518,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_518);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_538,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_538);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_558,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_558);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_578,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_578);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_598);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_5b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_5d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
          operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_5f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
          operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_618,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_618);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_618._M_dataplus._M_p != &local_618.field_2) {
          operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_638,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_638);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638._M_dataplus._M_p != &local_638.field_2) {
          operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2c,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_658,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_658);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != &local_658.field_2) {
          operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2c,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_678,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_678);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_678._M_dataplus._M_p != &local_678.field_2) {
          operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x39,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_698,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_698);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_698._M_dataplus._M_p != &local_698.field_2) {
          operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x39,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_6b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
          operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x40,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_6d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x40,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_6f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_6f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_718,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_718);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_718._M_dataplus._M_p != &local_718.field_2) {
            operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_738,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_738);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_738._M_dataplus._M_p != &local_738.field_2) {
            operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_758,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_778,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_778);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_798);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_7b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_7b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
            operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_7d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
          operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_7f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
          operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_818,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_818);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_818._M_dataplus._M_p != &local_818.field_2) {
          operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_838,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_838);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_dataplus._M_p != &local_838.field_2) {
          operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_858,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_858);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_dataplus._M_p != &local_858.field_2) {
          operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_878,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_878);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_878._M_dataplus._M_p != &local_878.field_2) {
          operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x29,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_898,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_898);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x29,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8b8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_8b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
          operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x36,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8d8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_8d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
          operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x36,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_8f8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_8f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
          operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3d,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_918,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_918);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918._M_dataplus._M_p != &local_918.field_2) {
          operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3d,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_938,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_938);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_938._M_dataplus._M_p != &local_938.field_2) {
          operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_958,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_958);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_dataplus._M_p != &local_958.field_2) {
            operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_978,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_978);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_978._M_dataplus._M_p != &local_978.field_2) {
            operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_998,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_998);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_998._M_dataplus._M_p != &local_998.field_2) {
            operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9b8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_9b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
            operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9d8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_9d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
            operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_9f8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_9f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
            operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a18,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_a18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
          operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a38,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_a38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
          operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a58,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_a58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
          operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a78,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_a78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
          operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a98,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_a98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
          operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ab8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_ab8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
          operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2b,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_ad8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_ad8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
          operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2b,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_af8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_af8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
          operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x38,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b18,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_b18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
          operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x38,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b38,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_b38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
          operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3f,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b58,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_b58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
          operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3f,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b78,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_b78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
          operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b98,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_b98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
            operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_bb8,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_bb8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
            operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_bd8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_bd8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
          operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_bf8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_bf8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
          operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2f,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c18,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_c18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
          operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2f,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c38,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_c38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
          operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 0xc) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c58,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_c58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
            operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c78,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_c78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
            operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c98,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_c98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
          operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_cb8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_cb8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
          operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x30,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_cd8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_cd8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
          operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x30,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_cf8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_cf8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
          operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        if (local_e88 != 0xc) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,DVar2,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d18,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_d18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
            operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,DVar2,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d38,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_d38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
            operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,local_e8c,
                   TYPE_LAST,(DataType)_Var10._M_p);
        local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d58,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_d58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
          operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,local_e8c,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d78,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_d78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
          operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x32,DVar1,TYPE_LAST,
                   (DataType)_Var10._M_p);
        local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d98,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_d98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
          operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x32,DVar1,
                   TYPE_FLOAT,(DataType)_Var10._M_p);
        local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_db8,_Var10._M_p,_Var10._M_p + lVar9);
        verifyShader(ctx,shaderType,&local_db8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
          operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var10._M_p != &local_ea0) {
          operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
        }
        CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
        bVar3 = true;
        if (!bVar4) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_b0,(_anonymous_namespace_ *)0x2d,dataType);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 != false) {
          if (local_e88 != 0xc) {
            DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,DVar2,
                       TYPE_LAST,(DataType)_Var10._M_p);
            local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_dd8,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_dd8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
              operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,DVar2,
                       TYPE_FLOAT,(DataType)_Var10._M_p);
            local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_df8,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_df8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
              operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,DVar2,
                       TYPE_LAST,(DataType)_Var10._M_p);
            local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e18,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_e18);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
              operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,DVar2,
                       TYPE_FLOAT,(DataType)_Var10._M_p);
            local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e38,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_e38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
              operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,DVar2,
                       TYPE_LAST,(DataType)_Var10._M_p);
            local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e58,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_e58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
              operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,DVar2,
                       TYPE_FLOAT,(DataType)_Var10._M_p);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,local_e8c,
                     TYPE_LAST,(DataType)_Var10._M_p);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2d0,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_2d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,local_e8c,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,local_e8c,
                     TYPE_LAST,(DataType)_Var10._M_p);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,local_e8c,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,local_e8c,
                     TYPE_LAST,(DataType)_Var10._M_p);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,local_e8c,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x2d,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_190);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x2d,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b0,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x3a,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x3a,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_VERTEX,0x41,DVar1,TYPE_LAST
                     ,(DataType)_Var10._M_p);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x41,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        CVar5.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar4 = glu::contextSupports(CVar5,(ApiType)0x23);
        bVar3 = true;
        if (!bVar4) {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_250,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_250);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar3 != false) {
          if (local_e88 != 0xc) {
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,
                       *(DataType *)((long)&(anonymous_namespace)::s_floatTypes + local_e88),
                       TYPE_FLOAT,(DataType)_Var10._M_p);
            local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e78,_Var10._M_p,_Var10._M_p + lVar9);
            verifyShader(ctx,shaderType,&local_e78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
              operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var10._M_p != &local_ea0) {
              operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
            }
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,local_e8c,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_270);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    ((string *)&stack0xfffffffffffff150,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_FRAGMENT,0x33,DVar1,
                     TYPE_FLOAT,(DataType)_Var10._M_p);
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,_Var10._M_p,_Var10._M_p + lVar9);
          verifyShader(ctx,shaderType,&local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &local_ea0) {
            operator_delete(_Var10._M_p,local_ea0._M_allocated_capacity + 1);
          }
        }
        lVar8 = local_e88 + 4;
      } while (lVar8 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar9 = local_2d8;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid P type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC2)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}